

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

char * x509v3_bytes_to_hex(uint8_t *in,size_t len)

{
  int iVar1;
  size_t sVar2;
  uint8_t *ret;
  size_t unused_len;
  CBB cbb;
  uint8_t *local_68;
  size_t local_60;
  CBB local_58;
  
  iVar1 = CBB_init(&local_58,len * 3 + 1);
  if (iVar1 != 0) {
    if (len != 0) {
      sVar2 = 0;
      do {
        if ((((sVar2 != 0) && (iVar1 = CBB_add_u8(&local_58,':'), iVar1 == 0)) ||
            (iVar1 = CBB_add_u8(&local_58,"0123456789ABCDEF"[in[sVar2] >> 4]), iVar1 == 0)) ||
           (iVar1 = CBB_add_u8(&local_58,"0123456789ABCDEF"[in[sVar2] & 0xf]), iVar1 == 0))
        goto LAB_00492069;
        sVar2 = sVar2 + 1;
      } while (len != sVar2);
    }
    iVar1 = CBB_add_u8(&local_58,'\0');
    if ((iVar1 != 0) && (iVar1 = CBB_finish(&local_58,&local_68,&local_60), iVar1 != 0)) {
      return (char *)local_68;
    }
  }
LAB_00492069:
  CBB_cleanup(&local_58);
  return (char *)0x0;
}

Assistant:

char *x509v3_bytes_to_hex(const uint8_t *in, size_t len) {
  CBB cbb;
  if (!CBB_init(&cbb, len * 3 + 1)) {
    goto err;
  }
  for (size_t i = 0; i < len; i++) {
    static const char hex[] = "0123456789ABCDEF";
    if ((i > 0 && !CBB_add_u8(&cbb, ':')) ||
        !CBB_add_u8(&cbb, hex[in[i] >> 4]) ||
        !CBB_add_u8(&cbb, hex[in[i] & 0xf])) {
      goto err;
    }
  }
  uint8_t *ret;
  size_t unused_len;
  if (!CBB_add_u8(&cbb, 0) || !CBB_finish(&cbb, &ret, &unused_len)) {
    goto err;
  }

  return (char *)ret;

err:
  CBB_cleanup(&cbb);
  return NULL;
}